

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3OsOpenMalloc(sqlite3_vfs *pVfs,char *zFile,sqlite3_file **ppFile,int flags,int *pOutFlags
                       )

{
  sqlite3_file *pFile_00;
  sqlite3_file *pFile;
  int rc;
  int *pOutFlags_local;
  int flags_local;
  sqlite3_file **ppFile_local;
  char *zFile_local;
  sqlite3_vfs *pVfs_local;
  
  pFile_00 = (sqlite3_file *)sqlite3MallocZero((long)pVfs->szOsFile);
  if (pFile_00 == (sqlite3_file *)0x0) {
    *ppFile = (sqlite3_file *)0x0;
    pFile._4_4_ = 7;
  }
  else {
    pFile._4_4_ = sqlite3OsOpen(pVfs,zFile,pFile_00,flags,pOutFlags);
    if (pFile._4_4_ == 0) {
      *ppFile = pFile_00;
    }
    else {
      sqlite3_free(pFile_00);
      *ppFile = (sqlite3_file *)0x0;
    }
  }
  return pFile._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3OsOpenMalloc(
  sqlite3_vfs *pVfs,
  const char *zFile,
  sqlite3_file **ppFile,
  int flags,
  int *pOutFlags
){
  int rc;
  sqlite3_file *pFile;
  pFile = (sqlite3_file *)sqlite3MallocZero(pVfs->szOsFile);
  if( pFile ){
    rc = sqlite3OsOpen(pVfs, zFile, pFile, flags, pOutFlags);
    if( rc!=SQLITE_OK ){
      sqlite3_free(pFile);
      *ppFile = 0;
    }else{
      *ppFile = pFile;
    }
  }else{
    *ppFile = 0;
    rc = SQLITE_NOMEM_BKPT;
  }
  assert( *ppFile!=0 || rc!=SQLITE_OK );
  return rc;
}